

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDX;
  GenericStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  SizeType elementCount;
  ParseErrorCode in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar3;
  GenericStringStream<rapidjson::UTF8<char>_> *this_00;
  GenericStringStream<rapidjson::UTF8<char>_> *this_01;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_02;
  
  this_02 = in_RDI;
  GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartArray((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    GenericStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_RDI,in_stack_ffffffffffffff9c,0x1abf4d);
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x1abf59);
    if (bVar1) {
      return;
    }
  }
  SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
             )CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (GenericStringStream<rapidjson::UTF8<char>_> *)in_RDI);
  bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x1abf87);
  if (!bVar1) {
    this_00 = in_RSI;
    CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
    if (CVar2 == ']') {
      GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndArray(this_02,(SizeType)((ulong)this_00 >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        GenericStringStream<rapidjson::UTF8<char>_>::Tell(this_00);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)in_RDI,in_stack_ffffffffffffff9c,0x1ac01b);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)0x1ac027);
      }
    }
    else {
      iVar3 = 0;
      do {
        ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (in_RDX,(GenericStringStream<rapidjson::UTF8<char>_> *)
                          CONCAT44(iVar3,in_stack_ffffffffffffffa8),in_RDI);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x1ac067);
        if (bVar1) {
          return;
        }
        iVar3 = iVar3 + 1;
        SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                  ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                   (GenericStringStream<rapidjson::UTF8<char>_> *)in_RDI);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x1ac09c);
        if (bVar1) {
          return;
        }
        this_01 = this_00;
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(this_00);
        if (CVar2 == ',') {
          GenericStringStream<rapidjson::UTF8<char>_>::Take(this_00);
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                     (GenericStringStream<rapidjson::UTF8<char>_> *)in_RDI);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x1ac111);
          this_00 = this_01;
          if (bVar1) {
            return;
          }
        }
        else {
          this_00 = this_01;
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(this_01);
          if (CVar2 == ']') {
            GenericStringStream<rapidjson::UTF8<char>_>::Take(this_01);
            bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndArray(this_02,(SizeType)((ulong)this_00 >> 0x20));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return;
            }
            GenericStringStream<rapidjson::UTF8<char>_>::Tell(this_00);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)in_RDI,in_stack_ffffffffffffff9c,0x1ac1ac);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x1ac1b8);
            return;
          }
          GenericStringStream<rapidjson::UTF8<char>_>::Tell(this_00);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)in_RDI,in_stack_ffffffffffffff9c,0x1ac1f2);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x1ac1fe);
          if (bVar1) {
            return;
          }
        }
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(this_00);
      } while (CVar2 != ']');
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndArray(this_02,(SizeType)((ulong)this_00 >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        GenericStringStream<rapidjson::UTF8<char>_>::Tell(this_00);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)in_RDI,in_stack_ffffffffffffff9c,0x1ac261);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x1ac26d);
        if (bVar1) {
          return;
        }
      }
      GenericStringStream<rapidjson::UTF8<char>_>::Take(this_00);
    }
  }
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }